

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O3

void blend_a64_vmask_b10_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar7;
  undefined1 auVar6 [16];
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  
  auVar4 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      auVar6 = pshuflw(ZEXT116(*mask),ZEXT116(*mask),0);
      sVar5 = auVar6._0_2_;
      sVar7 = auVar6._2_2_;
      lVar3 = 0;
      do {
        puVar1 = src0 + lVar3;
        puVar2 = src1 + lVar3;
        uVar8 = pavgw((ushort)(*puVar1 * sVar5 + *puVar2 * (auVar4._0_2_ - sVar5)) >> 5,0);
        uVar9 = pavgw((ushort)(puVar1[1] * sVar7 + puVar2[1] * (auVar4._2_2_ - sVar7)) >> 5,0);
        uVar10 = pavgw((ushort)(puVar1[2] * sVar5 + puVar2[2] * (auVar4._4_2_ - sVar5)) >> 5,0);
        uVar11 = pavgw((ushort)(puVar1[3] * sVar7 + puVar2[3] * (auVar4._6_2_ - sVar7)) >> 5,0);
        uVar12 = pavgw((ushort)(puVar1[4] * sVar5 + puVar2[4] * (auVar4._8_2_ - sVar5)) >> 5,0);
        uVar13 = pavgw((ushort)(puVar1[5] * sVar7 + puVar2[5] * (auVar4._10_2_ - sVar7)) >> 5,0);
        uVar14 = pavgw((ushort)(puVar1[6] * sVar5 + puVar2[6] * (auVar4._12_2_ - sVar5)) >> 5,0);
        uVar15 = pavgw((ushort)(puVar1[7] * sVar7 + puVar2[7] * (auVar4._14_2_ - sVar7)) >> 5,0);
        puVar1 = dst + lVar3;
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar1[2] = uVar10;
        puVar1[3] = uVar11;
        puVar1[4] = uVar12;
        puVar1[5] = uVar13;
        puVar1[6] = uVar14;
        puVar1[7] = uVar15;
        lVar3 = lVar3 + 8;
      } while ((int)lVar3 < w);
    }
    mask = mask + 1;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_vmask_b10_w8n_sse4_1(uint16_t *dst, uint32_t dst_stride,
                                           const uint16_t *src0,
                                           uint32_t src0_stride,
                                           const uint16_t *src1,
                                           uint32_t src1_stride,
                                           const uint8_t *mask, int w, int h) {
  blend_a64_vmask_bn_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                src1_stride, mask, w, h, blend_8_b10);
}